

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::Matrix4x4::translation(Matrix4x4 *__return_storage_ptr__,Vector3D *t)

{
  double dVar1;
  double *pdVar2;
  Vector3D *t_local;
  Matrix4x4 *B;
  
  Matrix4x4(__return_storage_ptr__);
  pdVar2 = operator()(__return_storage_ptr__,0,0);
  *pdVar2 = 1.0;
  pdVar2 = operator()(__return_storage_ptr__,0,1);
  *pdVar2 = 0.0;
  pdVar2 = operator()(__return_storage_ptr__,0,2);
  *pdVar2 = 0.0;
  dVar1 = t->x;
  pdVar2 = operator()(__return_storage_ptr__,0,3);
  *pdVar2 = dVar1;
  pdVar2 = operator()(__return_storage_ptr__,1,0);
  *pdVar2 = 0.0;
  pdVar2 = operator()(__return_storage_ptr__,1,1);
  *pdVar2 = 1.0;
  pdVar2 = operator()(__return_storage_ptr__,1,2);
  *pdVar2 = 0.0;
  dVar1 = t->y;
  pdVar2 = operator()(__return_storage_ptr__,1,3);
  *pdVar2 = dVar1;
  pdVar2 = operator()(__return_storage_ptr__,2,0);
  *pdVar2 = 0.0;
  pdVar2 = operator()(__return_storage_ptr__,2,1);
  *pdVar2 = 0.0;
  pdVar2 = operator()(__return_storage_ptr__,2,2);
  *pdVar2 = 1.0;
  dVar1 = t->z;
  pdVar2 = operator()(__return_storage_ptr__,2,3);
  *pdVar2 = dVar1;
  pdVar2 = operator()(__return_storage_ptr__,3,0);
  *pdVar2 = 0.0;
  pdVar2 = operator()(__return_storage_ptr__,3,1);
  *pdVar2 = 0.0;
  pdVar2 = operator()(__return_storage_ptr__,3,2);
  *pdVar2 = 0.0;
  pdVar2 = operator()(__return_storage_ptr__,3,3);
  *pdVar2 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::translation(Vector3D t) {
    Matrix4x4 B;

    B(0, 0) = 1.; B(0, 1) = 0.; B(0, 2) = 0.; B(0, 3) = t.x;
    B(1, 0) = 0.; B(1, 1) = 1.; B(1, 2) = 0.; B(1, 3) = t.y;
    B(2, 0) = 0.; B(2, 1) = 0.; B(2, 2) = 1.; B(2, 3) = t.z;
    B(3, 0) = 0.; B(3, 1) = 0.; B(3, 2) = 0.; B(3, 3) = 1.;

    return B;
  }